

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGAddStates(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGStatesPtr states,
                       xmlRelaxNGValidStatePtr state)

{
  int iVar1;
  xmlRelaxNGValidStatePtr *ppxVar2;
  int size;
  xmlRelaxNGValidStatePtr *tmp;
  int i;
  xmlRelaxNGValidStatePtr state_local;
  xmlRelaxNGStatesPtr states_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  if ((state == (xmlRelaxNGValidStatePtr)0x0) || (states == (xmlRelaxNGStatesPtr)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    if (states->maxState <= states->nbState) {
      iVar1 = states->maxState << 1;
      ppxVar2 = (xmlRelaxNGValidStatePtr *)(*xmlRealloc)(states->tabState,(long)iVar1 << 3);
      if (ppxVar2 == (xmlRelaxNGValidStatePtr *)0x0) {
        xmlRngVErrMemory(ctxt);
        return -1;
      }
      states->tabState = ppxVar2;
      states->maxState = iVar1;
    }
    for (tmp._4_4_ = 0; tmp._4_4_ < states->nbState; tmp._4_4_ = tmp._4_4_ + 1) {
      iVar1 = xmlRelaxNGEqualValidState(ctxt,state,states->tabState[tmp._4_4_]);
      if (iVar1 != 0) {
        xmlRelaxNGFreeValidState(ctxt,state);
        return 0;
      }
    }
    iVar1 = states->nbState;
    states->nbState = iVar1 + 1;
    states->tabState[iVar1] = state;
    ctxt_local._4_4_ = 1;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlRelaxNGAddStates(xmlRelaxNGValidCtxtPtr ctxt,
                    xmlRelaxNGStatesPtr states,
                    xmlRelaxNGValidStatePtr state)
{
    int i;

    if (state == NULL || states == NULL) {
        return (-1);
    }
    if (states->nbState >= states->maxState) {
        xmlRelaxNGValidStatePtr *tmp;
        int size;

        size = states->maxState * 2;
        tmp = (xmlRelaxNGValidStatePtr *) xmlRealloc(states->tabState,
                                                     (size) *
                                                     sizeof
                                                     (xmlRelaxNGValidStatePtr));
        if (tmp == NULL) {
            xmlRngVErrMemory(ctxt);
            return (-1);
        }
        states->tabState = tmp;
        states->maxState = size;
    }
    for (i = 0; i < states->nbState; i++) {
        if (xmlRelaxNGEqualValidState(ctxt, state, states->tabState[i])) {
            xmlRelaxNGFreeValidState(ctxt, state);
            return (0);
        }
    }
    states->tabState[states->nbState++] = state;
    return (1);
}